

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O1

int dwarf_get_frame_instruction_a
              (Dwarf_Frame_Instr_Head head,Dwarf_Unsigned instr_index,
              Dwarf_Unsigned *instr_offset_in_instrs,Dwarf_Small *cfa_operation,
              char **fields_description,Dwarf_Unsigned *u0,Dwarf_Unsigned *u1,Dwarf_Unsigned *u2,
              Dwarf_Signed *s0,Dwarf_Signed *s1,Dwarf_Unsigned *code_alignment_factor,
              Dwarf_Signed *data_alignment_factor,Dwarf_Block *expression_block,Dwarf_Error *error)

{
  Dwarf_Frame_Instr pDVar1;
  Dwarf_Unsigned DVar2;
  Dwarf_Ptr pvVar3;
  Dwarf_Unsigned DVar4;
  undefined7 uVar5;
  char *msg;
  Dwarf_Debug dbg;
  
  if (head == (Dwarf_Frame_Instr_Head)0x0) {
    msg = "DW_DLE_CFA_INSTRUCTION_ERROR: Head argument NULL  calling dwarf_get_frame_instruction";
  }
  else {
    dbg = head->fh_dbg;
    if (dbg != (Dwarf_Debug)0x0) {
      if (head->fh_array_count <= instr_index) {
        return -1;
      }
      pDVar1 = head->fh_array[instr_index];
      if (pDVar1 != (Dwarf_Frame_Instr)0x0) {
        *instr_offset_in_instrs = pDVar1->fi_instr_offset;
        *cfa_operation = pDVar1->fi_op;
        *fields_description = pDVar1->fi_fields;
        *u0 = pDVar1->fi_u0;
        *u1 = pDVar1->fi_u1;
        *u2 = pDVar1->fi_u2;
        *s0 = pDVar1->fi_s0;
        *s1 = pDVar1->fi_s1;
        if (code_alignment_factor != (Dwarf_Unsigned *)0x0) {
          *code_alignment_factor = pDVar1->fi_code_align_factor;
        }
        if (data_alignment_factor != (Dwarf_Signed *)0x0) {
          *data_alignment_factor = pDVar1->fi_data_align_factor;
        }
        DVar2 = (pDVar1->fi_expr).bl_len;
        pvVar3 = (pDVar1->fi_expr).bl_data;
        uVar5 = *(undefined7 *)&(pDVar1->fi_expr).field_0x11;
        DVar4 = (pDVar1->fi_expr).bl_section_offset;
        expression_block->bl_from_loclist = (pDVar1->fi_expr).bl_from_loclist;
        *(undefined7 *)&expression_block->field_0x11 = uVar5;
        expression_block->bl_section_offset = DVar4;
        expression_block->bl_len = DVar2;
        expression_block->bl_data = pvVar3;
        return 0;
      }
      msg = "DW_DLE_CFA_INSTRUCTION_ERROR: instr array missing calling dwarf_get_frame_instruction";
      goto LAB_001a6324;
    }
    msg = 
    "DW_DLE_CFA_INSTRUCTION_ERROR: Head missing Dwarf_Debug field  calling dwarf_get_frame_instruction"
    ;
  }
  dbg = (Dwarf_Debug)0x0;
LAB_001a6324:
  _dwarf_error_string(dbg,error,0x1e5,msg);
  return 1;
}

Assistant:

int
dwarf_get_frame_instruction_a(Dwarf_Frame_Instr_Head head,
    Dwarf_Unsigned    instr_index,
    Dwarf_Unsigned  * instr_offset_in_instrs,
    Dwarf_Small     * cfa_operation,
    const char     ** fields_description,
    Dwarf_Unsigned  * u0,
    Dwarf_Unsigned  * u1,
    Dwarf_Unsigned  * u2,
    Dwarf_Signed    * s0,
    Dwarf_Signed    * s1,
    Dwarf_Unsigned  * code_alignment_factor,
    Dwarf_Signed    * data_alignment_factor,
    Dwarf_Block     * expression_block,
    Dwarf_Error     * error)
{
    Dwarf_Frame_Instr ip = 0;
    Dwarf_Debug dbg = 0;
    if (!head) {
        _dwarf_error_string(dbg, error,DW_DLE_CFA_INSTRUCTION_ERROR,
            "DW_DLE_CFA_INSTRUCTION_ERROR: Head argument NULL "
            " calling dwarf_get_frame_instruction");
        return DW_DLV_ERROR;
    }
    if (!head->fh_dbg) {
        _dwarf_error_string(dbg, error,DW_DLE_CFA_INSTRUCTION_ERROR,
            "DW_DLE_CFA_INSTRUCTION_ERROR: Head missing "
            "Dwarf_Debug field "
            " calling dwarf_get_frame_instruction");
        return DW_DLV_ERROR;
    }
    dbg = head->fh_dbg;
    if (instr_index >= head->fh_array_count) {
        return DW_DLV_NO_ENTRY;
    }
    ip = head->fh_array[instr_index];
    if (!ip) {
        _dwarf_error_string(dbg, error,DW_DLE_CFA_INSTRUCTION_ERROR,
            "DW_DLE_CFA_INSTRUCTION_ERROR: instr array missing "
            "calling dwarf_get_frame_instruction");
        return DW_DLV_ERROR;
    }
    *instr_offset_in_instrs = ip->fi_instr_offset;
    *cfa_operation = ip->fi_op;
    *fields_description = ip->fi_fields;
    *u0 = ip->fi_u0;
    *u1 = ip->fi_u1;
    *u2 = ip->fi_u2;
    *s0 = ip->fi_s0;
    *s1 = ip->fi_s1;
    /*  These next two might be known to caller already,
        so let caller not pass useless pointers. */
    if (code_alignment_factor) {
        *code_alignment_factor = ip->fi_code_align_factor;
    }
    if (data_alignment_factor) {
        *data_alignment_factor = ip->fi_data_align_factor;
    }
    *expression_block = ip->fi_expr;
    return DW_DLV_OK;
}